

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qutil.cc
# Opt level: O0

void getenv_test(void)

{
  bool bVar1;
  ostream *poVar2;
  void *this;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_59;
  string local_58;
  undefined1 local_28 [8];
  string val;
  
  std::__cxx11::string::string((string *)local_28);
  poVar2 = std::operator<<((ostream *)&std::cout,"IN_TESTSUITE: ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"IN_TESTSUITE",&local_59);
  bVar1 = QUtil::get_env(&local_58,(string *)local_28);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,bVar1);
  poVar2 = std::operator<<(poVar2,": ");
  poVar2 = std::operator<<(poVar2,(string *)local_28);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  poVar2 = std::operator<<((ostream *)&std::cout,"HAGOOGAMAGOOGLE: ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"HAGOOGAMAGOOGLE",&local_81);
  bVar1 = QUtil::get_env(&local_80,(string *)0x0);
  this = (void *)std::ostream::operator<<(poVar2,bVar1);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  std::__cxx11::string::~string((string *)local_28);
  return;
}

Assistant:

void
getenv_test()
{
    std::string val;
    std::cout << "IN_TESTSUITE: " << QUtil::get_env("IN_TESTSUITE", &val) << ": " << val
              << std::endl;
    // Hopefully this environment variable is not defined.
    std::cout << "HAGOOGAMAGOOGLE: " << QUtil::get_env("HAGOOGAMAGOOGLE") << std::endl;
}